

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastSet.h
# Opt level: O2

CFastSet<unsigned_int> * __thiscall
CFastSet<unsigned_int>::operator=(CFastSet<unsigned_int> *this,CFastSet<unsigned_int> *set)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  if (this != set) {
    iVar3 = this->elementsSize;
    puVar2 = this->elements;
    if (iVar3 != set->elementsSize) {
      iVar3 = set->elementsSize;
      if (puVar2 != (uint *)0x0) {
        operator_delete__(puVar2);
        iVar3 = set->elementsSize;
      }
      this->elementsSize = iVar3;
      uVar5 = 0xffffffffffffffff;
      if (-1 < iVar3) {
        uVar5 = (long)iVar3 * 4;
      }
      puVar2 = (uint *)operator_new__(uVar5);
      this->elements = puVar2;
    }
    puVar1 = set->elements;
    for (lVar4 = 0; lVar4 < iVar3; lVar4 = lVar4 + 1) {
      puVar2[lVar4] = puVar1[lVar4];
      iVar3 = this->elementsSize;
    }
  }
  return this;
}

Assistant:

CFastSet<T>& CFastSet<T>::operator=( const CFastSet& set )
{
	if( this != &set ) {
		if( elementsSize != set.elementsSize ) {
			delete[] elements;
			elementsSize = set.elementsSize;
			elements = new T[elementsSize];
		}
		for( int i = 0; i < elementsSize; i++ ) {
			elements[i] = set.elements[i];
		}
	}
	return *this;
}